

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

double __thiscall PolymerWrapper::CalculatePropensity(PolymerWrapper *this)

{
  double dVar1;
  bool bVar2;
  SpeciesTracker *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double new_prop;
  PolymerWrapper *this_local;
  
  if (((this->super_Reaction).remove_ & 1U) == 1) {
    (this->super_Reaction).old_prop_ = 0.0;
  }
  this_00 = SpeciesTracker::Instance();
  this_01 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::empty(this_01);
  if (!bVar2) {
    peVar3 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->polymer_);
    Polymer::UpdateAllPropensities(peVar3);
  }
  peVar3 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->polymer_);
  dVar4 = Polymer::prop_sum(peVar3);
  dVar1 = (this->super_Reaction).old_prop_;
  peVar3 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->polymer_);
  dVar5 = Polymer::prop_sum(peVar3);
  (this->super_Reaction).old_prop_ = dVar5;
  return dVar4 - dVar1;
}

Assistant:

double PolymerWrapper::CalculatePropensity() {
    if (remove_ == true) {
      old_prop_ = 0;
    }
    if (!SpeciesTracker::Instance().codon_map().empty()) {
      polymer_->UpdateAllPropensities();
    }
    double new_prop = polymer_->prop_sum() - old_prop_;
    old_prop_ = polymer_->prop_sum();
    return new_prop;
  }